

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundex.cpp
# Opt level: O1

string * Soundex::encodeString(string *__return_storage_ptr__,string *word)

{
  bool bVar1;
  int iVar2;
  Soundex *pSVar3;
  char *c_00;
  char *c_01;
  ulong uVar4;
  vector<char,_std::allocator<char>_> *__range1;
  Soundex SVar5;
  char c;
  string nextEncoding;
  string prevEncoding;
  Soundex local_79;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  toupper((int)*(word->_M_dataplus)._M_p);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  encodeChar_abi_cxx11_(&local_50,(Soundex *)(__return_storage_ptr__->_M_dataplus)._M_p,c_00);
  if (1 < word->_M_string_length) {
    uVar4 = 1;
    SVar5 = (Soundex)0x0;
    do {
      iVar2 = toupper((int)(word->_M_dataplus)._M_p[uVar4]);
      local_79 = SUB41(iVar2,0);
      encodeChar_abi_cxx11_(&local_78,&local_79,c_01);
      iVar2 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar2 != 0) {
        bVar1 = VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
        if (VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start ==
            VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
LAB_001035ae:
          if (((!bVar1) && (local_78._M_string_length == local_50._M_string_length)) &&
             ((local_78._M_string_length == 0 ||
              (iVar2 = bcmp(local_78._M_dataplus._M_p,local_50._M_dataplus._M_p,
                            local_78._M_string_length), iVar2 == 0)))) goto LAB_001035f5;
        }
        else {
          pSVar3 = (Soundex *)
                   VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (SVar5 != (Soundex)*VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start) {
            do {
              pSVar3 = pSVar3 + 1;
              bVar1 = pSVar3 != (Soundex *)
                                VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish;
              if (pSVar3 == (Soundex *)
                            VOWELS.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish) break;
            } while (SVar5 != *pSVar3);
            goto LAB_001035ae;
          }
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
        std::__cxx11::string::_M_assign((string *)&local_50);
      }
LAB_001035f5:
      SVar5 = local_79;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < word->_M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Soundex::encodeString(const string &word) {
    string encoded = string(1, toupper(word[0]));
    char prevChar = 0;
    string prevEncoding = encodeChar(encoded[0]);
    for (int i = 1; i < word.length(); i++) {
        char c = toupper(word[i]);
        string nextEncoding = encodeChar(c);
        if (nextEncoding != "" && (isVowel(prevChar) || nextEncoding != prevEncoding)) {
            encoded += nextEncoding;
            prevEncoding = nextEncoding;
        }
        prevChar = c;
    }
    return encoded;
}